

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# usprep.cpp
# Opt level: O3

int32_t usprep_map(UStringPrepProfile *profile,UChar *src,int32_t srcLength,UChar *dest,
                  int32_t destCapacity,int32_t options,UParseError *parseError,UErrorCode *status)

{
  UChar UVar1;
  UChar UVar2;
  uint16_t *puVar3;
  int32_t iVar4;
  int iVar5;
  ulong uVar6;
  ushort uVar7;
  int iVar8;
  int32_t iVar9;
  uint uVar10;
  ushort uVar11;
  char cVar12;
  long lVar13;
  int iVar14;
  long lVar15;
  uint uVar16;
  long lVar17;
  
  if (srcLength < 1) {
    iVar9 = 0;
  }
  else {
    iVar9 = 0;
    iVar14 = 0;
    do {
      iVar8 = iVar14 + 1;
      UVar1 = src[iVar14];
      uVar16 = (uint)(ushort)UVar1;
      if (iVar8 == srcLength || (uVar16 & 0xfc00) != 0xd800) {
LAB_002feb17:
        uVar10 = ((ushort)UVar1 >> 5) + 0x140;
        if ((uVar16 & 0xfc00) != 0xd800) {
          uVar10 = (uint)((ushort)UVar1 >> 5);
        }
        puVar3 = (profile->sprepTrie).index;
        uVar11 = puVar3[(uVar16 & 0x1f) + (uint)puVar3[uVar10] * 4];
        iVar5 = -1;
        iVar14 = iVar8;
      }
      else {
        UVar2 = src[iVar8];
        if (((ushort)UVar2 & 0xfc00) != 0xdc00) goto LAB_002feb17;
        uVar16 = (uint)(ushort)UVar1 * 0x400 + (uint)(ushort)UVar2 + 0xfca02400;
        if (uVar16 < 0x110000) {
          puVar3 = (profile->sprepTrie).index;
          iVar4 = (*(profile->sprepTrie).getFoldingOffset)
                            ((uint32_t)
                             puVar3[(uVar16 >> 10 & 0x1f) +
                                    (uint)puVar3[(uVar16 >> 10) + 0xd7c0 >> 5] * 4]);
          if (iVar4 < 1) {
            uVar11 = (ushort)(profile->sprepTrie).initialValue;
          }
          else {
            puVar3 = (profile->sprepTrie).index;
            uVar11 = puVar3[((ushort)UVar2 & 0x1f) +
                            (uint)puVar3[iVar4 + ((ushort)UVar2 >> 5 & 0x1f)] * 4];
          }
          iVar5 = -2;
          iVar14 = iVar14 + 2;
        }
        else {
          uVar11 = (ushort)(profile->sprepTrie).initialValue;
          iVar5 = -2;
          iVar14 = iVar14 + 2;
        }
      }
      if (uVar11 == 0) {
        iVar8 = 4;
        uVar7 = 0;
        cVar12 = '\0';
      }
      else {
        uVar10 = (uint)uVar11;
        if (uVar11 < 0xfff0) {
          uVar7 = uVar11 >> 2;
          if ((uVar11 & 2) == 0) {
            uVar7 = (short)uVar11 >> 2;
          }
          if ((uVar10 & 0xfffffffc) != 0xfefc) {
            cVar12 = (char)((uVar10 & 2) >> 1);
            iVar8 = 1;
            goto LAB_002feba7;
          }
          iVar8 = 3;
        }
        else {
          iVar8 = uVar10 - 0xfff0;
        }
        uVar7 = 0;
        cVar12 = '\0';
      }
LAB_002feba7:
      if (iVar8 == 0 && (options & 1U) == 0) {
        uprv_syntaxError_63(src,iVar14 + iVar5,srcLength,parseError);
        *status = U_IDNA_UNASSIGNED_ERROR;
        return 0;
      }
      if (iVar8 != 3) {
        if (iVar8 == 1) {
          iVar8 = (int)(short)uVar7;
          if (cVar12 != '\0') {
            uVar6 = 1;
            if (iVar8 < profile->indexes[3] || profile->indexes[4] <= iVar8) {
              uVar6 = 2;
              if ((iVar8 < profile->indexes[4] || profile->indexes[5] <= iVar8) &&
                 ((iVar8 < profile->indexes[5] || (uVar6 = 3, profile->indexes[6] <= iVar8)))) {
                uVar6 = (ulong)profile->mappingData[(short)uVar7];
                if (uVar6 == 0) goto LAB_002fece8;
                iVar8 = iVar8 + 1;
              }
            }
            lVar17 = (long)iVar8;
            lVar15 = (long)iVar9;
            lVar13 = 0;
            do {
              if (lVar15 < destCapacity) {
                dest[lVar15] = profile->mappingData[lVar17];
              }
              lVar15 = lVar15 + 1;
              lVar13 = lVar13 + -1;
              lVar17 = lVar17 + 1;
            } while (-lVar13 != uVar6);
            iVar9 = iVar9 - (int)lVar13;
            goto LAB_002fece8;
          }
          uVar16 = uVar16 - iVar8;
        }
        if ((int)uVar16 < 0x10000) {
          if (iVar9 < destCapacity) {
            dest[iVar9] = (UChar)uVar16;
          }
          iVar9 = iVar9 + 1;
        }
        else {
          if (iVar9 + 1 < destCapacity) {
            dest[iVar9] = (short)(uVar16 >> 10) + L'ퟀ';
            dest[iVar9 + 1] = (UChar)uVar16 & 0x3ffU | 0xdc00;
          }
          iVar9 = iVar9 + 2;
        }
      }
LAB_002fece8:
    } while (iVar14 < srcLength);
  }
  iVar9 = u_terminateUChars_63(dest,destCapacity,iVar9,status);
  return iVar9;
}

Assistant:

static int32_t 
usprep_map(  const UStringPrepProfile* profile, 
             const UChar* src, int32_t srcLength, 
             UChar* dest, int32_t destCapacity,
             int32_t options,
             UParseError* parseError,
             UErrorCode* status ){
    
    uint16_t result;
    int32_t destIndex=0;
    int32_t srcIndex;
    UBool allowUnassigned = (UBool) ((options & USPREP_ALLOW_UNASSIGNED)>0);
    UStringPrepType type;
    int16_t value;
    UBool isIndex;
    const int32_t* indexes = profile->indexes;

    // no error checking the caller check for error and arguments
    // no string length check the caller finds out the string length

    for(srcIndex=0;srcIndex<srcLength;){
        UChar32 ch;

        U16_NEXT(src,srcIndex,srcLength,ch);
        
        result=0;

        UTRIE_GET16(&profile->sprepTrie,ch,result);
        
        type = getValues(result, value, isIndex);

        // check if the source codepoint is unassigned
        if(type == USPREP_UNASSIGNED && allowUnassigned == FALSE){

            uprv_syntaxError(src,srcIndex-U16_LENGTH(ch), srcLength,parseError);
            *status = U_STRINGPREP_UNASSIGNED_ERROR;
            return 0;
            
        }else if(type == USPREP_MAP){
            
            int32_t index, length;

            if(isIndex){
                index = value;
                if(index >= indexes[_SPREP_ONE_UCHAR_MAPPING_INDEX_START] &&
                         index < indexes[_SPREP_TWO_UCHARS_MAPPING_INDEX_START]){
                    length = 1;
                }else if(index >= indexes[_SPREP_TWO_UCHARS_MAPPING_INDEX_START] &&
                         index < indexes[_SPREP_THREE_UCHARS_MAPPING_INDEX_START]){
                    length = 2;
                }else if(index >= indexes[_SPREP_THREE_UCHARS_MAPPING_INDEX_START] &&
                         index < indexes[_SPREP_FOUR_UCHARS_MAPPING_INDEX_START]){
                    length = 3;
                }else{
                    length = profile->mappingData[index++];
         
                }

                /* copy mapping to destination */
                for(int32_t i=0; i< length; i++){
                    if(destIndex < destCapacity  ){
                        dest[destIndex] = profile->mappingData[index+i];
                    }
                    destIndex++; /* for pre-flighting */
                }  
                continue;
            }else{
                // subtract the delta to arrive at the code point
                ch -= value;
            }

        }else if(type==USPREP_DELETE){
             // just consume the codepoint and contine
            continue;
        }
        //copy the code point into destination
        if(ch <= 0xFFFF){
            if(destIndex < destCapacity ){
                dest[destIndex] = (UChar)ch;
            }
            destIndex++;
        }else{
            if(destIndex+1 < destCapacity ){
                dest[destIndex]   = U16_LEAD(ch);
                dest[destIndex+1] = U16_TRAIL(ch);
            }
            destIndex +=2;
        }
       
    }
        
    return u_terminateUChars(dest, destCapacity, destIndex, status);
}